

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCopier::InstallDirectory
          (cmFileCopier *this,char *source,char *destination,MatchProperties *match_properties)

{
  cmCommand *this_00;
  bool bVar1;
  int iVar2;
  unsigned_long uVar3;
  char *pcVar4;
  ostream *poVar5;
  mode_t permissions_00;
  mode_t permissions_01;
  unsigned_long dindex;
  allocator local_1e9;
  char *local_1e8;
  Directory dir;
  mode_t permissions;
  string toPath;
  ostringstream e;
  
  local_1e8 = source;
  std::__cxx11::string::string((string *)&e,destination,(allocator *)&toPath);
  bVar1 = cmsys::SystemTools::FileIsDirectory((string *)&e);
  (*this->_vptr_cmFileCopier[4])(this,destination,1,(ulong)!bVar1);
  std::__cxx11::string::~string((string *)&e);
  bVar1 = cmsys::SystemTools::MakeDirectory(destination);
  if (bVar1) {
    permissions = match_properties->Permissions;
    if (permissions == 0) {
      permissions = this->DirPermissions;
    }
    if (permissions == 0) {
      cmsys::SystemTools::GetPermissions(local_1e8,&permissions);
    }
    permissions_01 = permissions | 0x1c0;
    permissions_00 = permissions;
    if ((~permissions & 0x1c0) == 0) {
      permissions_00 = 0;
      permissions_01 = permissions;
    }
    bVar1 = SetPermissions(this,destination,permissions_01);
    if (bVar1) {
      cmsys::Directory::Directory(&dir);
      if ((local_1e8 != (char *)0x0) && (*local_1e8 != '\0')) {
        std::__cxx11::string::string((string *)&e,local_1e8,(allocator *)&toPath);
        cmsys::Directory::Load(&dir,(string *)&e);
        std::__cxx11::string::~string((string *)&e);
      }
      uVar3 = cmsys::Directory::GetNumberOfFiles(&dir);
      dindex = 0;
      do {
        if (uVar3 == dindex) {
          bVar1 = SetPermissions(this,destination,permissions_00);
LAB_003060a2:
          cmsys::Directory::~Directory(&dir);
          return bVar1;
        }
        pcVar4 = cmsys::Directory::GetFile(&dir,dindex);
        if (((*pcVar4 != '.') || (pcVar4[1] != '\0')) &&
           ((pcVar4 = cmsys::Directory::GetFile(&dir,dindex), *pcVar4 != '.' ||
            ((pcVar4[1] != '.' || (pcVar4[2] != '\0')))))) {
          std::__cxx11::string::string((string *)&e,local_1e8,(allocator *)&toPath);
          std::__cxx11::string::append((char *)&e);
          cmsys::Directory::GetFile(&dir,dindex);
          std::__cxx11::string::append((char *)&e);
          std::__cxx11::string::string((string *)&toPath,destination,&local_1e9);
          std::__cxx11::string::append((char *)&toPath);
          cmsys::Directory::GetFile(&dir,dindex);
          std::__cxx11::string::append((char *)&toPath);
          iVar2 = (*this->_vptr_cmFileCopier[2])(this,_e,toPath._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&toPath);
          std::__cxx11::string::~string((string *)&e);
          if ((char)iVar2 == '\0') {
            bVar1 = false;
            goto LAB_003060a2;
          }
        }
        dindex = dindex + 1;
      } while( true );
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
    poVar5 = std::operator<<((ostream *)&e,this->Name);
    poVar5 = std::operator<<(poVar5," cannot make directory \"");
    poVar5 = std::operator<<(poVar5,destination);
    poVar5 = std::operator<<(poVar5,"\": ");
    cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
    std::operator<<(poVar5,(string *)&toPath);
    std::__cxx11::string::~string((string *)&toPath);
    this_00 = &this->FileCommand->super_cmCommand;
    std::__cxx11::stringbuf::str();
    cmCommand::SetError(this_00,&toPath);
    std::__cxx11::string::~string((string *)&toPath);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
  }
  return false;
}

Assistant:

bool cmFileCopier::InstallDirectory(const char* source,
                                    const char* destination,
                                    MatchProperties const& match_properties)
{
  // Inform the user about this directory installation.
  this->ReportCopy(destination, TypeDir,
                   !cmSystemTools::FileIsDirectory(destination));

  // Make sure the destination directory exists.
  if(!cmSystemTools::MakeDirectory(destination))
    {
    std::ostringstream e;
    e << this->Name << " cannot make directory \"" << destination << "\": "
      << cmSystemTools::GetLastSystemError();
    this->FileCommand->SetError(e.str());
    return false;
    }

  // Compute the requested permissions for the destination directory.
  mode_t permissions = (match_properties.Permissions?
                        match_properties.Permissions : this->DirPermissions);
  if(!permissions)
    {
    // No permissions were explicitly provided but the user requested
    // that the source directory permissions be used.
    cmSystemTools::GetPermissions(source, permissions);
    }

  // Compute the set of permissions required on this directory to
  // recursively install files and subdirectories safely.
  mode_t required_permissions =
    mode_owner_read | mode_owner_write | mode_owner_execute;

  // If the required permissions are specified it is safe to set the
  // final permissions now.  Otherwise we must add the required
  // permissions temporarily during file installation.
  mode_t permissions_before = 0;
  mode_t permissions_after = 0;
  if((permissions & required_permissions) == required_permissions)
    {
    permissions_before = permissions;
    }
  else
    {
    permissions_before = permissions | required_permissions;
    permissions_after = permissions;
    }

  // Set the required permissions of the destination directory.
  if(!this->SetPermissions(destination, permissions_before))
    {
    return false;
    }

  // Load the directory contents to traverse it recursively.
  cmsys::Directory dir;
  if(source && *source)
    {
    dir.Load(source);
    }
  unsigned long numFiles = static_cast<unsigned long>(dir.GetNumberOfFiles());
  for(unsigned long fileNum = 0; fileNum < numFiles; ++fileNum)
    {
    if(!(strcmp(dir.GetFile(fileNum), ".") == 0 ||
         strcmp(dir.GetFile(fileNum), "..") == 0))
      {
      std::string fromPath = source;
      fromPath += "/";
      fromPath += dir.GetFile(fileNum);
      std::string toPath = destination;
      toPath += "/";
      toPath += dir.GetFile(fileNum);
      if(!this->Install(fromPath.c_str(), toPath.c_str()))
        {
        return false;
        }
      }
    }

  // Set the requested permissions of the destination directory.
  return this->SetPermissions(destination, permissions_after);
}